

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Bitmask columnsInIndex(Index *pIdx)

{
  long lVar1;
  Bitmask BVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)pIdx->nColumn;
  BVar2 = 0;
  while (0 < (long)uVar3) {
    lVar1 = uVar3 - 1;
    uVar3 = uVar3 - 1;
    uVar4 = 1L << ((byte)pIdx->aiColumn[lVar1] & 0x3f);
    if (0x3e < (ushort)pIdx->aiColumn[lVar1]) {
      uVar4 = 0;
    }
    BVar2 = BVar2 | uVar4;
  }
  return BVar2;
}

Assistant:

static Bitmask columnsInIndex(Index *pIdx){
  Bitmask m = 0;
  int j;
  for(j=pIdx->nColumn-1; j>=0; j--){
    int x = pIdx->aiColumn[j];
    if( x>=0 ){
      testcase( x==BMS-1 );
      testcase( x==BMS-2 );
      if( x<BMS-1 ) m |= MASKBIT(x);
    }
  }
  return m;
}